

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.h
# Opt level: O0

Expression * wasm::Bits::makeSignExt(Expression *value,Index bytes,Module *wasm)

{
  int32_t iVar1;
  bool bVar2;
  Expression *pEVar3;
  Binary *pBVar4;
  int32_t local_88;
  Type local_68;
  Type local_60;
  Builder local_58;
  Builder builder_1;
  int shifts_1;
  Type local_40;
  Builder local_38;
  Builder builder;
  int shifts;
  Module *wasm_local;
  Index bytes_local;
  Expression *value_local;
  
  builder.wasm._4_4_ = 2;
  bVar2 = wasm::Type::operator==(&value->type,(BasicType *)((long)&builder.wasm + 4));
  value_local = value;
  if (bVar2) {
    if ((bytes == 1) || (bytes == 2)) {
      builder.wasm._0_4_ = 0x10;
      if (bytes == 1) {
        builder.wasm._0_4_ = 0x18;
      }
      Builder::Builder(&local_38,wasm);
      iVar1 = (int32_t)builder.wasm;
      wasm::Type::Type(&local_40,i32);
      pEVar3 = LiteralUtils::makeFromInt32(iVar1,local_40,wasm);
      pBVar4 = Builder::makeBinary(&local_38,ShlInt32,value,pEVar3);
      iVar1 = (int32_t)builder.wasm;
      wasm::Type::Type((Type *)&shifts_1,i32);
      pEVar3 = LiteralUtils::makeFromInt32(iVar1,_shifts_1,wasm);
      value_local = (Expression *)
                    Builder::makeBinary(&local_38,ShrSInt32,(Expression *)pBVar4,pEVar3);
    }
    else if (bytes != 4) {
      __assert_fail("bytes == 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/bits.h"
                    ,0x5a,"Expression *wasm::Bits::makeSignExt(Expression *, Index, Module &)");
    }
  }
  else {
    builder_1.wasm._4_4_ = 3;
    bVar2 = wasm::Type::operator==(&value->type,(BasicType *)((long)&builder_1.wasm + 4));
    if (!bVar2) {
      __assert_fail("value->type == Type::i64",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/bits.h"
                    ,0x5d,"Expression *wasm::Bits::makeSignExt(Expression *, Index, Module &)");
    }
    if (((bytes == 1) || (bytes == 2)) || (bytes == 4)) {
      if (bytes == 1) {
        local_88 = 0x38;
      }
      else {
        local_88 = 0x20;
        if (bytes == 2) {
          local_88 = 0x30;
        }
      }
      builder_1.wasm._0_4_ = local_88;
      Builder::Builder(&local_58,wasm);
      iVar1 = (int32_t)builder_1.wasm;
      wasm::Type::Type(&local_60,i64);
      pEVar3 = LiteralUtils::makeFromInt32(iVar1,local_60,wasm);
      pBVar4 = Builder::makeBinary(&local_58,ShlInt64,value,pEVar3);
      iVar1 = (int32_t)builder_1.wasm;
      wasm::Type::Type(&local_68,i64);
      pEVar3 = LiteralUtils::makeFromInt32(iVar1,local_68,wasm);
      value_local = (Expression *)
                    Builder::makeBinary(&local_58,ShrSInt64,(Expression *)pBVar4,pEVar3);
    }
    else if (bytes != 8) {
      __assert_fail("bytes == 8",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/bits.h"
                    ,0x69,"Expression *wasm::Bits::makeSignExt(Expression *, Index, Module &)");
    }
  }
  return value_local;
}

Assistant:

inline Expression* makeSignExt(Expression* value, Index bytes, Module& wasm) {
  if (value->type == Type::i32) {
    if (bytes == 1 || bytes == 2) {
      auto shifts = bytes == 1 ? 24 : 16;
      Builder builder(wasm);
      return builder.makeBinary(
        ShrSInt32,
        builder.makeBinary(
          ShlInt32,
          value,
          LiteralUtils::makeFromInt32(shifts, Type::i32, wasm)),
        LiteralUtils::makeFromInt32(shifts, Type::i32, wasm));
    }
    assert(bytes == 4);
    return value; // nothing to do
  } else {
    assert(value->type == Type::i64);
    if (bytes == 1 || bytes == 2 || bytes == 4) {
      auto shifts = bytes == 1 ? 56 : (bytes == 2 ? 48 : 32);
      Builder builder(wasm);
      return builder.makeBinary(
        ShrSInt64,
        builder.makeBinary(
          ShlInt64,
          value,
          LiteralUtils::makeFromInt32(shifts, Type::i64, wasm)),
        LiteralUtils::makeFromInt32(shifts, Type::i64, wasm));
    }
    assert(bytes == 8);
    return value; // nothing to do
  }
}